

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

bool __thiscall
dg::GenericCallGraph<const_llvm::Function_*>::FuncNode::addCall(FuncNode *this,FuncNode *x)

{
  bool bVar1;
  value_type *in_RSI;
  FuncNode *in_RDI;
  FuncNode *in_stack_ffffffffffffffe0;
  FuncNode *this_00;
  undefined1 local_1;
  
  this_00 = in_RDI;
  bVar1 = calls(in_stack_ffffffffffffffe0,in_RDI);
  if (bVar1) {
    local_1 = false;
  }
  else {
    std::
    vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
    ::push_back((vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                 *)this_00,in_RSI);
    bVar1 = isCalledBy(in_stack_ffffffffffffffe0,in_RDI);
    if (!bVar1) {
      std::
      vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
      ::push_back((vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                   *)in_RDI,(value_type *)in_RDI);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool addCall(FuncNode *x) {
            if (calls(x))
                return false;
            _calls.push_back(x);
            if (!x->isCalledBy(this))
                x->_callers.push_back(this);
            return true;
        }